

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_stepping_padding.cpp
# Opt level: O2

void test_2d_static<5ul,1ul,0ul,1ul,30ul,30ul>(void)

{
  long lVar1;
  int line;
  int j;
  char *expr2;
  unsigned_long *puVar2;
  int i;
  long lVar3;
  int i_1;
  unsigned_long *local_ef0;
  long local_ee8;
  size_t true_idx;
  unsigned_long *local_ed8;
  int *local_ed0;
  long local_ec8;
  unsigned_long *local_ec0;
  int dptr [930];
  
  dptr[0]._0_1_ = 1;
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x26,
             "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(bool *)dptr,(bool *)&true_idx);
  dptr[0] = 1;
  dptr[1] = 0;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x28,
             "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)dptr,(int *)&true_idx);
  dptr[0] = 0x1e;
  dptr[1] = 0;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x29,
             "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)dptr,(int *)&true_idx);
  dptr[0] = 900;
  dptr[1] = 0;
  true_idx = 900;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x2b,
             "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)dptr,&true_idx);
  dptr[0] = 0x3a2;
  dptr[1] = 0;
  true_idx = 0x3a2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x2c,
             "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)dptr,&true_idx);
  dptr[0]._0_1_ = 1;
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x34,
             "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(bool *)dptr,(bool *)&true_idx);
  dptr[0] = 5;
  dptr[1] = 0;
  true_idx = 5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","StepX",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x36,
             "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)dptr,&true_idx);
  dptr[0] = 0x1e;
  dptr[1] = 0;
  true_idx = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","StepY",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x37,
             "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)dptr,&true_idx);
  dptr[0] = 0xb4;
  dptr[1] = 0;
  true_idx = 0xb4;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / StepX) * (Y / StepY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x39,
             "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)dptr,&true_idx);
  dptr[0] = 0x3a2;
  dptr[1] = 0;
  true_idx = 0x3a2;
  puVar2 = (unsigned_long *)dptr;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x3a,
             "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,puVar2,&true_idx);
  local_ee8 = 0;
  lVar1 = 0;
  while (lVar1 != 0x1e) {
    local_ed8 = puVar2;
    local_ec8 = lVar1;
    for (lVar3 = 0; lVar3 != 0x1e; lVar3 = lVar3 + 1) {
      local_ef0 = (unsigned_long *)(local_ee8 + lVar3);
      true_idx = (size_t)local_ef0;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x44,
                 "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_ef0,&true_idx);
      local_ed0 = dptr + true_idx;
      local_ef0 = puVar2;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x46,
                 "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_ef0,&local_ed0);
      *(undefined4 *)puVar2 = 0x2a;
      local_ef0 = (unsigned_long *)CONCAT44(local_ef0._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x4a,
                 "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int *)puVar2,(int *)&local_ef0);
      puVar2 = (unsigned_long *)((long)puVar2 + 4);
    }
    local_ee8 = local_ee8 + 0x1e;
    puVar2 = local_ed8 + 0xf;
    lVar1 = local_ec8 + 1;
  }
  puVar2 = (unsigned_long *)dptr;
  local_ee8 = 0;
  for (lVar1 = 0; lVar1 != 0x1f; lVar1 = lVar1 + 1) {
    local_ed8 = puVar2;
    for (lVar3 = 0; lVar3 != 0x1e; lVar3 = lVar3 + 1) {
      local_ef0 = (unsigned_long *)(local_ee8 + lVar3);
      true_idx = (size_t)local_ef0;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x53,
                 "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_ef0,&true_idx);
      local_ed0 = dptr + true_idx;
      local_ef0 = puVar2;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x55,
                 "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_ef0,&local_ed0);
      if (lVar1 == 0x1e) {
        *(int *)puVar2 = 0x18;
        local_ef0 = (unsigned_long *)CONCAT44(local_ef0._4_4_,0x18);
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","24",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,100,
                   "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)puVar2,(int *)&local_ef0);
      }
      puVar2 = (unsigned_long *)((long)puVar2 + 4);
    }
    local_ee8 = local_ee8 + 0x1e;
    puVar2 = local_ed8 + 0xf;
  }
  puVar2 = (unsigned_long *)dptr;
  local_ee8 = 0;
  for (local_ec8 = 0; local_ec8 != 0x1e; local_ec8 = local_ec8 + 1) {
    local_ed8 = puVar2;
    for (lVar1 = 0; lVar1 != 0x1e; lVar1 = lVar1 + 5) {
      local_ef0 = (unsigned_long *)(local_ee8 + lVar1);
      true_idx = (size_t)local_ef0;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(sub_l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x70,
                 "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_ef0,&true_idx);
      local_ed0 = dptr + true_idx;
      local_ef0 = puVar2;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x72,
                 "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_ef0,&local_ed0);
      *(int *)puVar2 = 0x47;
      local_ef0 = (unsigned_long *)CONCAT44(local_ef0._4_4_,0x47);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[sub_l.index(i, j)])","71",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x76,
                 "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int *)puVar2,(int *)&local_ef0);
      puVar2 = (unsigned_long *)((long)puVar2 + 0x14);
    }
    local_ee8 = local_ee8 + 0x1e;
    puVar2 = local_ed8 + 0xf;
  }
  puVar2 = (unsigned_long *)dptr;
  local_ec8 = 0;
  for (local_ed8 = (unsigned_long *)0x0; local_ed8 != (unsigned_long *)0x1f;
      local_ed8 = (unsigned_long *)((long)local_ed8 + 1)) {
    local_ee8 = 0;
    local_ec0 = puVar2;
    for (lVar1 = 0; lVar1 != 0x1e; lVar1 = lVar1 + 1) {
      local_ef0 = (unsigned_long *)(local_ec8 + lVar1);
      true_idx = (size_t)local_ef0;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x7f,
                 "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_ef0,&true_idx);
      local_ed0 = dptr + true_idx;
      local_ef0 = puVar2;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x81,
                 "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_ef0,&local_ed0);
      lVar3 = local_ee8;
      if (local_ed8 == (unsigned_long *)0x1e) {
        local_ef0 = (unsigned_long *)CONCAT44(local_ef0._4_4_,0x18);
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","24",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0x8c,
                   "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)puVar2,(int *)&local_ef0);
        lVar3 = local_ee8;
      }
      else {
        if ((char)((char)(((ushort)lVar1 & 0xff) / 5) * '\x05' + (char)local_ee8) == '\0') {
          local_ef0 = (unsigned_long *)CONCAT44(local_ef0._4_4_,0x47);
          expr2 = "71";
          line = 0x97;
        }
        else {
          local_ef0 = (unsigned_long *)CONCAT44(local_ef0._4_4_,0x2a);
          expr2 = "42";
          line = 0x9c;
        }
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])",expr2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,line,
                   "void test_2d_static() [StepX = 5UL, StepY = 1UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)puVar2,(int *)&local_ef0);
      }
      local_ee8 = CONCAT71((int7)((ulong)lVar3 >> 8),(char)lVar3 + -1);
      puVar2 = (unsigned_long *)((long)puVar2 + 4);
    }
    local_ec8 = local_ec8 + 0x1e;
    puVar2 = local_ec0 + 0xf;
  }
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    static_assert(0 == (X % StepX), "X must be divisable by StepX");
    static_assert(0 == (Y % StepY), "Y must be divisable by StepY");

    layout_mapping_left<
        dimensions<X, Y>
      , dimensions<1, 1>
      , dimensions<PadX, PadY>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + PadX) * (Y + PadY));

    layout_mapping_left<
        dimensions<X / StepX, Y / StepY>
      , dimensions<StepX, StepY>
      , dimensions<PadX, PadY>
    > const sub_l{};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), StepX);
    BOOST_TEST_EQ((sub_l.stride(1)), StepY);

    BOOST_TEST_EQ((sub_l.size()), (X / StepX) * (Y / StepY));
    BOOST_TEST_EQ((sub_l.span()), (X + PadX) * (Y + PadY));

    int dptr[(X + PadX) * (Y + PadY)];

    // Set all real elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (i) + (l[0] + l.pads()[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l[0] + l.pads()[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            dptr[l.index(i, j)] = 24; 

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }
    }

    // Set every (StepXth, StepYth) element to 71.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const p = l.pads();
        auto const s = sub_l.steps();
        auto const true_idx = (s[0] * i) + (sub_l[0] * s[0] + p[0]) * (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 71;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 71);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l[0] + l.pads()[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }

        // Real element.
        else
        {
            // Real element in the strided sub-box.
            if (  (0 == (i % sub_l.steps()[0]))
               && (0 == (j % sub_l.steps()[1]))
               )
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 71);
            }
            // Real element not in the strided sub-box.
            else
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
            }
        }
    }
}